

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_scanline.h
# Opt level: O2

void agg::
     render_scanline_aa_solid<agg::scanline_p8,agg::renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,agg::order_bgra>,agg::row_accessor<unsigned_char>>>,agg::rgba8T<agg::linear>>
               (scanline_p8 *sl,
               renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
               *ren,rgba8T<agg::linear> *color)

{
  short sVar1;
  int y;
  span *psVar2;
  int x1;
  cover_type **ppcVar3;
  uint uVar4;
  ulong uVar5;
  
  y = sl->m_y;
  psVar2 = (sl->m_spans).m_array;
  uVar5 = (ulong)((long)sl->m_cur_span - (long)psVar2) >> 4;
  ppcVar3 = &psVar2[1].covers;
  do {
    x1 = (int)((span *)(ppcVar3 + -1))->x;
    sVar1 = *(coord_type *)((long)ppcVar3 + -6);
    if (sVar1 < 1) {
      renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
      ::blend_hline(ren,x1,y,~(int)sVar1 + x1,color,**ppcVar3);
    }
    else {
      renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
      ::blend_solid_hspan(ren,x1,y,(int)sVar1,color,*ppcVar3);
    }
    ppcVar3 = ppcVar3 + 2;
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 0);
  return;
}

Assistant:

void render_scanline_aa_solid(const Scanline& sl, 
                                  BaseRenderer& ren, 
                                  const ColorT& color)
    {
        int y = sl.y();
        unsigned num_spans = sl.num_spans();
        typename Scanline::const_iterator span = sl.begin();

        for(;;)
        {
            int x = span->x;
            if(span->len > 0)
            {
                ren.blend_solid_hspan(x, y, (unsigned)span->len, 
                                      color, 
                                      span->covers);
            }
            else
            {
                ren.blend_hline(x, y, (unsigned)(x - span->len - 1), 
                                color, 
                                *(span->covers));
            }
            if(--num_spans == 0) break;
            ++span;
        }
    }